

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O0

void __thiscall Uniforms::printBuffers(Uniforms *this)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  size_type sVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  allocator local_d1;
  key_type local_d0;
  allocator local_a9;
  key_type local_a8;
  allocator local_81;
  key_type local_80;
  allocator local_49;
  key_type local_48;
  ulong local_28;
  size_t i_2;
  size_t i_1;
  size_t i;
  Uniforms *this_local;
  
  i_1 = 0;
  i = (size_t)this;
  while( true ) {
    sVar3 = i_1;
    sVar4 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::size(&this->buffers);
    if (sVar4 <= sVar3) break;
    poVar5 = std::operator<<((ostream *)&std::cout,"uniform sampler2D u_buffer");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,i_1);
    poVar5 = std::operator<<(poVar5,";");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    i_1 = i_1 + 1;
  }
  i_2 = 0;
  while( true ) {
    sVar3 = i_2;
    sVar4 = std::vector<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>::size
                      (&this->doubleBuffers);
    if (sVar4 <= sVar3) break;
    poVar5 = std::operator<<((ostream *)&std::cout,"uniform sampler2D u_doubleBuffer");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,i_2);
    poVar5 = std::operator<<(poVar5,";");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    i_2 = i_2 + 1;
  }
  local_28 = 0;
  while( true ) {
    uVar2 = local_28;
    sVar4 = std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::size(&this->pyramids);
    if (sVar4 <= uVar2) break;
    poVar5 = std::operator<<((ostream *)&std::cout,"uniform sampler2D u_pyramid");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_28);
    poVar5 = std::operator<<(poVar5,";");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_28 = local_28 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"u_scene",&local_49);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
           ::operator[](&this->functions,&local_48);
  bVar1 = pmVar6->present;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if ((bVar1 & 1U) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"uniform sampler2D u_scene;");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"u_sceneDepth",&local_81);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
           ::operator[](&this->functions,&local_80);
  bVar1 = pmVar6->present;
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  if ((bVar1 & 1U) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"uniform sampler2D u_sceneDepth;");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"u_scenePosition",&local_a9);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
           ::operator[](&this->functions,&local_a8);
  bVar1 = pmVar6->present;
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  if ((bVar1 & 1U) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"uniform sampler2D u_scenePosition;");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"u_sceneNormal",&local_d1);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
           ::operator[](&this->functions,&local_d0);
  bVar1 = pmVar6->present;
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  if ((bVar1 & 1U) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"uniform sampler2D u_sceneNormal;");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Uniforms::printBuffers() {
    for (size_t i = 0; i < buffers.size(); i++)
        std::cout << "uniform sampler2D u_buffer" << i << ";" << std::endl;

    for (size_t i = 0; i < doubleBuffers.size(); i++)
        std::cout << "uniform sampler2D u_doubleBuffer" << i << ";" << std::endl;

    for (size_t i = 0; i < pyramids.size(); i++)
        std::cout << "uniform sampler2D u_pyramid" << i << ";" << std::endl;  

    if (functions["u_scene"].present)
        std::cout << "uniform sampler2D u_scene;" << std::endl;

    if (functions["u_sceneDepth"].present)
        std::cout << "uniform sampler2D u_sceneDepth;" << std::endl;

    if (functions["u_scenePosition"].present)
        std::cout << "uniform sampler2D u_scenePosition;" << std::endl;

    if (functions["u_sceneNormal"].present)
        std::cout << "uniform sampler2D u_sceneNormal;" << std::endl;
}